

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinRoberts_fp.c
# Opt level: O0

void PrintFinalStats(void *kmem)

{
  undefined4 uVar1;
  undefined8 in_RDI;
  int retval;
  long nfe;
  long nni;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  void *in_stack_ffffffffffffffe8;
  undefined8 local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  uVar1 = KINGetNumNonlinSolvIters(in_RDI,&local_10);
  check_retval(in_stack_ffffffffffffffe8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc);
  uVar1 = KINGetNumFuncEvals(local_8,&stack0xffffffffffffffe8);
  check_retval(in_stack_ffffffffffffffe8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc);
  printf("\nFinal Statistics.. \n\n");
  printf("nni      = %6ld    nfe     = %6ld \n",local_10,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void PrintFinalStats(void* kmem)
{
  long int nni, nfe;
  int retval;

  /* Main solver statistics */

  retval = KINGetNumNonlinSolvIters(kmem, &nni);
  check_retval(&retval, "KINGetNumNonlinSolvIters", 1);
  retval = KINGetNumFuncEvals(kmem, &nfe);
  check_retval(&retval, "KINGetNumFuncEvals", 1);

  printf("\nFinal Statistics.. \n\n");
  printf("nni      = %6ld    nfe     = %6ld \n", nni, nfe);
}